

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  bool bVar1;
  void *local_68 [2];
  void *local_58;
  long local_50;
  string local_48;
  TimeInMillis local_28;
  
  bVar1 = TestResult::Failed(&test_info->result_);
  local_28 = (test_info->result_).elapsed_time_;
  StreamableToString<long_long>((internal *)local_68,&local_28);
  String::Format((char *)&local_58,"event=TestEnd&passed=%d&elapsed_time=%sms\n",(ulong)!bVar1,
                 local_68[0]);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,local_58,local_50 + (long)local_58);
  Send(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_58 != (void *)0x0) {
    operator_delete__(local_58);
  }
  if (local_68[0] != (void *)0x0) {
    operator_delete__(local_68[0]);
  }
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) {
    Send(String::Format(
        "event=TestEnd&passed=%d&elapsed_time=%sms\n",
        (test_info.result())->Passed(),
        StreamableToString((test_info.result())->elapsed_time()).c_str()));
  }